

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

char * zt_cstr_cat(char *s1,ssize_t i1,ssize_t j1,char *s2,ssize_t i2,ssize_t j2)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  sVar1 = strlen(s1);
  if (sVar1 == 0) {
    lVar9 = 0;
    lVar8 = 0;
  }
  else {
    lVar5 = (i1 >> 0x3f & sVar1) + i1;
    if ((long)sVar1 <= lVar5) {
      lVar5 = sVar1 - 1;
    }
    lVar8 = (j1 >> 0x3f & sVar1) + j1;
    if ((long)sVar1 <= lVar8) {
      lVar8 = sVar1 - 1;
    }
    lVar9 = lVar8;
    if (lVar8 < lVar5) {
      lVar9 = lVar5;
    }
    if (lVar5 < lVar8) {
      lVar8 = lVar5;
    }
  }
  sVar1 = strlen(s2);
  if (sVar1 == 0) {
    lVar10 = 0;
    lVar5 = 0;
  }
  else {
    lVar6 = (i2 >> 0x3f & sVar1) + i2;
    if ((long)sVar1 <= lVar6) {
      lVar6 = sVar1 - 1;
    }
    lVar5 = (j2 >> 0x3f & sVar1) + j2;
    if ((long)sVar1 <= lVar5) {
      lVar5 = sVar1 - 1;
    }
    lVar10 = lVar5;
    if (lVar5 < lVar6) {
      lVar10 = lVar6;
    }
    if (lVar6 < lVar5) {
      lVar5 = lVar6;
    }
  }
  lVar2 = lVar8 - lVar9;
  lVar6 = -lVar2;
  if (0 < lVar2) {
    lVar6 = lVar2;
  }
  lVar3 = lVar5 - lVar10;
  lVar2 = -lVar3;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  pcVar4 = (char *)zt_malloc_p(lVar6 + lVar2 + 3);
  pcVar7 = pcVar4;
  for (; lVar8 <= lVar9; lVar8 = lVar8 + 1) {
    *pcVar7 = s1[lVar8];
    pcVar7 = pcVar7 + 1;
  }
  for (lVar8 = 0; lVar5 + lVar8 <= lVar10; lVar8 = lVar8 + 1) {
    pcVar7[lVar8] = s2[lVar8 + lVar5];
  }
  pcVar7[lVar8] = '\0';
  return pcVar4;
}

Assistant:

char *
zt_cstr_cat(const char *s1, ssize_t i1, ssize_t j1,
            const char *s2, ssize_t i2, ssize_t j2) {
    char * new;
    char * p;

    CONVERT(s1, i1, j1);
    CONVERT(s2, i2, j2);

    p = new = zt_malloc(char, IDXLEN(i1, j1) + IDXLEN(i2, j2) + 1);

    while (i1 <= j1) {
        *p++ = s1[i1++];
    }

    while (i2 <= j2) {
        *p++ = s2[i2++];
    }

    *p = '\0';
    return new;
}